

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode * JSONNode::newJSONNode(JSONNode *orig)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  JSONNode *pJVar3;
  
  pJVar3 = (JSONNode *)operator_new(8);
  piVar2 = orig->internal;
  psVar1 = &piVar2->refcount;
  *psVar1 = *psVar1 + 1;
  pJVar3->internal = piVar2;
  return pJVar3;
}

Assistant:

JSONNode * JSONNode::newJSONNode(const JSONNode & orig    JSON_MUTEX_COPY_DECL) {
	#ifdef JSON_MUTEX_CALLBACKS
		if (parentMutex != 0){
			JSONNode * temp = _newJSONNode(orig);
			temp -> set_mutex(parentMutex);
			return temp;
		}
	#endif
	return _newJSONNode(orig);
}